

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O2

Expr * __thiscall
SQCompilation::SQParser::parseCommaExpr(SQParser *this,SQExpressionContext expression_context)

{
  CommaExpr *expr;
  CommaExpr *this_00;
  Expr *expr_00;
  NestingChecker nc;
  NestingChecker local_30;
  
  NestingChecker::NestingChecker(&local_30,this);
  expr = (CommaExpr *)Expression(this,expression_context);
  this_00 = expr;
  if (this->_token == 0x2c) {
    this_00 = newNode<SQCompilation::CommaExpr,Arena*>(this,this->_astArena);
    CommaExpr::addExpression(this_00,(Expr *)expr);
    while (this->_token == 0x2c) {
      Lex(this);
      expr_00 = Expression(this,expression_context);
      CommaExpr::addExpression(this_00,expr_00);
    }
  }
  (local_30._p)->_depth = (local_30._p)->_depth - local_30._depth;
  return &this_00->super_Expr;
}

Assistant:

Expr* SQParser::parseCommaExpr(SQExpressionContext expression_context)
{
    NestingChecker nc(this);
    Expr *expr = Expression(expression_context);

    if (_token == ',') {
        CommaExpr *cm = newNode<CommaExpr>(arena());
        cm->addExpression(expr);
        expr = cm;
        while (_token == ',') {
            Lex();
            cm->addExpression(Expression(expression_context));
        }
    }

    return expr;
}